

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O3

void BQMTester<cimod::Dense>::test_DenseBQMFunctionTest_flip_variable(void)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  Linear<unsigned_int,_double> bqm_linear;
  double offset;
  Quadratic<unsigned_int,_double> bqm_quadratic;
  BQM<uint32_t,_double,_cimod::Dense> bqm;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  key_type local_1a0;
  AssertHelper local_198;
  internal local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_180;
  double local_148;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> local_108;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_50;
  
  local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 2;
  local_108._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_4000000000000000;
  local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x1;
  local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_50,&local_108,
             &local_108._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish,0,&local_88,&local_180,&local_140);
  local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)&DAT_200000001;
  local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3fe0000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_88,&local_108,
             &local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols,0,&local_180,&local_140,local_190);
  local_148 = 0.5;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            (&local_108,(Linear<unsigned_int,_double> *)&local_50,
             (Quadratic<unsigned_int,_double> *)&local_88,&local_148,SPIN);
  local_180._M_buckets._0_4_ = 1;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::flip_variable
            (&local_108,(uint *)&local_180);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)&local_180,&local_108);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_quadratic
            ((Quadratic<unsigned_int,_double> *)&local_140,&local_108);
  local_1a0.first = 1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_180,&local_1a0.first);
  testing::internal::CmpHelperFloatingPointEQ<double>(local_190,"bqm_linear[1]","-1.0",*pmVar1,-1.0)
  ;
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2cc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1a0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  local_1a0.first = 2;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_180,&local_1a0.first);
  testing::internal::CmpHelperFloatingPointEQ<double>(local_190,"bqm_linear[2]","2.0",*pmVar1,2.0);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2cd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1a0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  local_1a0 = (key_type)&DAT_200000001;
  pmVar2 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_140,&local_1a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_190,"bqm_quadratic[std::make_pair(1, 2)]","-0.5",*pmVar2,-0.5);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1a0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_180);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108._label_to_idx._M_h);
  if (local_108._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_108._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_50);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_flip_variable()
    {
        Linear<uint32_t, double> linear{{1, 1.0}, {2, 2.0} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(1, 2), 0.5} };
        double offset = 0.5;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        bqm.flip_variable(1);
        auto bqm_linear = bqm.get_linear();
        auto bqm_quadratic = bqm.get_quadratic();

        // check biases
        EXPECT_DOUBLE_EQ(bqm_linear[1], -1.0);
        EXPECT_DOUBLE_EQ(bqm_linear[2], 2.0);
        EXPECT_DOUBLE_EQ(bqm_quadratic[std::make_pair(1, 2)], -0.5);
    }